

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O3

void __thiscall
TestSchema::readData<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>
          (TestSchema *this,Parser<avro::ReaderImpl<avro::NullValidator>_> *p)

{
  ReaderImpl<avro::NullValidator> *pRVar1;
  TestSchema *this_00;
  uint8_t uVar2;
  int iVar3;
  uint64_t uVar4;
  long lVar5;
  ostream *poVar6;
  bool boolval;
  int64_t longval;
  int32_t intval;
  undefined4 uStack_fc;
  int32_t *local_f8;
  bool *local_f0;
  assertion_result local_e8;
  _func_int **local_d0;
  TestSchema *local_c8;
  uint8_t ival;
  undefined1 local_b8;
  undefined8 *local_b0;
  int32_t **local_a8;
  undefined **local_a0;
  ReaderImpl<avro::NullValidator> *local_98;
  undefined **local_90;
  const_string local_88;
  int32_t local_74;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  bool **local_58;
  lazy_ostream local_50;
  undefined8 *local_40;
  char *local_38;
  
  pRVar1 = &p->reader_;
  local_c8 = this;
  uVar4 = avro::ReaderImpl<avro::NullValidator>::readVarInt(pRVar1);
  lVar5 = avro::decodeZigzag64(uVar4);
  longval = lVar5;
  poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
  local_70 = (undefined **)CONCAT71(local_70._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_70,1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1dc9a0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b6ac5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x162;
  local_50.m_empty = false;
  local_d0 = (_func_int **)&PTR__lazy_ostream_001d8390;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d8390;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(lVar5 == 1000);
  local_f8 = &intval;
  _intval = CONCAT44(uStack_fc,1000);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_88.m_end = "";
  local_58 = &local_f0;
  local_68 = 0;
  local_90 = &PTR__lazy_ostream_001d83d0;
  local_70 = &PTR__lazy_ostream_001d83d0;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f8;
  local_b8 = 0;
  local_a0 = &PTR__lazy_ostream_001d8350;
  _ival = &PTR__lazy_ostream_001d8350;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = (bool *)&longval;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_50,&local_88,0x162,CHECK,CHECK_EQUAL,2,"longval",&local_70,"1000",
             &ival);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  this_00 = local_c8;
  readMap<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(local_c8,p);
  readArray<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(this_00,p);
  uVar4 = avro::ReaderImpl<avro::NullValidator>::readVarInt(pRVar1);
  longval = avro::decodeZigzag64(uVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enum choice ",0xc);
  poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
  local_70._0_1_ = (true_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_70,1);
  local_98 = pRVar1;
  uVar4 = avro::ReaderImpl<avro::NullValidator>::readVarInt(pRVar1);
  longval = avro::decodeZigzag64(uVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Union path ",0xb);
  poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
  local_70._0_1_ = (true_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_70,1);
  readMap<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(this_00,p);
  readNestedRecord<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(this_00,p);
  _ival = (undefined **)((ulong)_ival & 0xffffffffffffff00);
  avro::BufferReader::read<unsigned_char>(&(p->reader_).reader_,&ival,(true_type *)&local_70);
  uVar2 = ival;
  boolval = ival != '\0';
  poVar6 = std::ostream::_M_insert<bool>(true);
  local_70 = (undefined **)CONCAT71(local_70._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_70,1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1dc9a0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b6ac5);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar2 != '\0');
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x175;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_d0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  _intval = CONCAT71(stack0xffffffffffffff01,1);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_88.m_end = "";
  local_f0 = &boolval;
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_001d8a38;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = &local_f0;
  local_f8 = &intval;
  local_b8 = 0;
  _ival = &PTR__lazy_ostream_001d8a38;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_50,&local_88,0x175,CHECK,CHECK_EQUAL,2,"boolval",&local_70,"true",
             &ival);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  readFixed<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(local_c8,p);
  pRVar1 = local_98;
  uVar4 = avro::ReaderImpl<avro::NullValidator>::readVarInt(local_98);
  longval = avro::decodeZigzag64(uVar4);
  poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
  local_70 = (undefined **)CONCAT71(local_70._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_70,1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1dc9a0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b6ac5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x17d;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_d0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  _intval = 0x614b1cb2bfaa4383;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(longval == 0x614b1cb2bfaa4383);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_88.m_end = "";
  local_f0 = (bool *)&longval;
  local_68 = 0;
  local_70 = local_90;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = &local_f0;
  local_f8 = &intval;
  local_b8 = 0;
  _ival = &PTR__lazy_ostream_001d8f80;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_50,&local_88,0x17d,CHECK,CHECK_EQUAL,2,"longval",&local_70,
             "7010728798977672067LL",&ival);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  uVar4 = avro::ReaderImpl<avro::NullValidator>::readVarInt(pRVar1);
  iVar3 = avro::decodeZigzag32((uint)uVar4);
  _intval = CONCAT44(uStack_fc,iVar3);
  poVar6 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
  local_70 = (undefined **)CONCAT71(local_70._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_70,1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1dc9a0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b6ac5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x182;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_d0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == -0xd80);
  local_f8 = &local_74;
  local_74 = -0xd80;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_88.m_end = "";
  local_f0 = (bool *)&intval;
  local_68 = 0;
  local_70 = local_a0;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = &local_f0;
  local_b8 = 0;
  _ival = local_a0;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_50,&local_88,0x182,CHECK,CHECK_EQUAL,2,"intval",&local_70,"-3456",
             &ival);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  return;
}

Assistant:

void readData(Parser &p)
    {
        printNext(p);
        p.readRecord();

        printNext(p);
        int64_t longval = p.readLong();
        std::cout << longval << '\n';
        BOOST_CHECK_EQUAL(longval, 1000);

        readMap(p);
        readArray(p);

        printNext(p);
        longval = p.readEnum();
        std::cout << "Enum choice " << longval << '\n';

        printNext(p);
        longval = p.readUnion();
        std::cout << "Union path " << longval << '\n';
        readMap(p);

        readNestedRecord(p);

        printNext(p);
        bool boolval = p.readBool();
        std::cout << boolval << '\n';
        BOOST_CHECK_EQUAL(boolval, true);

        printNext(p);
        readFixed(p);

        printNext(p);
        longval = p.readLong();
        std::cout << longval << '\n';
        BOOST_CHECK_EQUAL(longval, 7010728798977672067LL);

        printNext(p);
        int32_t intval = p.readInt();
        std::cout << intval << '\n';
        BOOST_CHECK_EQUAL(intval, -3456);
        p.readRecordEnd();
    }